

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

size_t __thiscall
trieste::PassDef::apply_special<true,false,true>(PassDef *this,Node *root,Match *match)

{
  TokenDef *pTVar1;
  long lVar2;
  undefined8 *puVar3;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *node;
  char cVar5;
  bool bVar6;
  ptrdiff_t pVar7;
  iterator iVar8;
  unsigned_long uVar9;
  element_type *peVar10;
  size_t sVar11;
  PassDef *pPVar12;
  undefined8 *puVar13;
  iterator start;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start_1;
  Node root_1;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_98;
  PassDef *local_88;
  size_t local_80;
  _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  local_78;
  NodeIt local_60;
  element_type *local_58;
  Token local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pTVar1 = (local_58->type_).def;
  if ((pTVar1->fl & 0x40) == 0) {
    lVar2 = *(long *)((long)(this->rule_map).map._M_elems +
                     (ulong)(pTVar1->default_map_id & 0xfffffff8));
    local_88 = this;
    if (*(char *)(lVar2 + 0x418) == '\0') {
      local_78._M_impl.super__Vector_impl_data._M_start =
           (pointer)(local_58->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_80 = 0;
LAB_00161869:
      if ((element_type *)local_78._M_impl.super__Vector_impl_data._M_start !=
          (element_type *)
          (local_58->children).
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar13 = *(undefined8 **)
                   (lVar2 + 0x18 +
                   (ulong)(((((((element_type *)local_78._M_impl.super__Vector_impl_data._M_start)->
                              super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                              super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->type_).def)->default_map_id & 0xfffffff8));
        puVar3 = (undefined8 *)puVar13[1];
        for (puVar13 = (undefined8 *)*puVar13; puVar13 != puVar3; puVar13 = puVar13 + 0x14) {
          match->index = 0;
          ((match->captures).
           super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first = false;
          local_98._M_ptr = (element_type *)local_78._M_impl.super__Vector_impl_data._M_start;
          cVar5 = (**(code **)(*(long *)*puVar13 + 0x20))
                            ((long *)*puVar13,&local_78,(Node *)&stack0xffffffffffffffa8,match);
          if (((cVar5 != '\0') &&
              (bVar6 = std::
                       any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>
                                 (local_98._M_ptr,local_78._M_impl.super__Vector_impl_data._M_start)
              , !bVar6)) &&
             (pVar7 = replace(local_88,match,(Effect<Node> *)(puVar13 + 0x10),(NodeIt *)&local_98,
                              (NodeIt *)&local_78,(Node *)&stack0xffffffffffffffa8), pVar7 != -1)) {
            local_80 = local_80 + pVar7;
            if ((local_88->direction_ & 4) == 0) {
              local_78._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(local_58->children).
                            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              local_78._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((enable_shared_from_this<trieste::NodeDef> *)
                             &(local_78._M_impl.super__Vector_impl_data._M_start)->first + pVar7);
            }
            goto LAB_00161869;
          }
          local_78._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._M_ptr;
        }
        local_78._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)local_78._M_impl.super__Vector_impl_data._M_start + 0x10);
        goto LAB_00161869;
      }
    }
    else {
      local_80 = 0;
    }
    local_98._M_ptr = (element_type *)&stack0xffffffffffffffa8;
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_58->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_78,
               (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)&local_98);
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_88->post_;
    local_40 = (element_type *)&(local_88->post_)._M_t._M_impl.super__Rb_tree_header;
    pPVar12 = local_88;
    while (local_78._M_impl.super__Vector_impl_data._M_start !=
           local_78._M_impl.super__Vector_impl_data._M_finish) {
      p_Var4 = &(local_78._M_impl.super__Vector_impl_data._M_finish[-1].first)->
                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
      node = (element_type *)
             local_78._M_impl.super__Vector_impl_data._M_finish[-1].second._M_current;
      peVar10 = p_Var4->_M_ptr;
      if (node == (element_type *)
                  (peVar10->children).
                  super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
        iVar8 = CLI::std::
                _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                ::find((_Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                        *)local_38._M_pi,&peVar10->type_);
        if ((element_type *)iVar8._M_node != local_40) {
          std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_98,p_Var4);
          uVar9 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator()
                            ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                             &iVar8._M_node[1]._M_parent,(shared_ptr<trieste::NodeDef> *)&local_98);
          local_80 = local_80 + uVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        }
        local_78._M_impl.super__Vector_impl_data._M_finish =
             local_78._M_impl.super__Vector_impl_data._M_finish + -1;
      }
      else {
        local_78._M_impl.super__Vector_impl_data._M_finish[-1].second._M_current =
             (shared_ptr<trieste::NodeDef> *)&node->type_;
        peVar10 = ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                  &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr;
        pTVar1 = (peVar10->type_).def;
        if ((pTVar1->fl & 0x40) == 0) {
          lVar2 = *(long *)((long)(pPVar12->rule_map).map._M_elems +
                           (ulong)(pTVar1->default_map_id & 0xfffffff8));
          if (*(char *)(lVar2 + 0x418) == '\0') {
            local_98._M_ptr =
                 (element_type *)
                 (peVar10->children).
                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_48.def = (TokenDef *)0x0;
LAB_001619f3:
            if (local_98._M_ptr !=
                (element_type *)
                (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                 &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr->children).
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              puVar13 = *(undefined8 **)
                         (lVar2 + 0x18 +
                         (ulong)((((((local_98._M_ptr)->
                                    super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->type_).def)->default_map_id & 0xfffffff8));
              puVar3 = (undefined8 *)puVar13[1];
              local_60._M_current = (shared_ptr<trieste::NodeDef> *)local_98._M_ptr;
              for (puVar13 = (undefined8 *)*puVar13; puVar13 != puVar3; puVar13 = puVar13 + 0x14) {
                match->index = 0;
                ((match->captures).
                 super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first = false;
                local_98._M_ptr = (element_type *)local_60._M_current;
                cVar5 = (**(code **)(*(long *)*puVar13 + 0x20))
                                  ((long *)*puVar13,&local_98,node,match);
                if (((cVar5 != '\0') &&
                    (bVar6 = std::
                             any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>
                                       (local_60._M_current,local_98._M_ptr), !bVar6)) &&
                   (pVar7 = replace(local_88,match,(Effect<Node> *)(puVar13 + 0x10),&local_60,
                                    (NodeIt *)&local_98,(Node *)node), pVar7 != -1)) {
                  local_48.def = (TokenDef *)((long)&(local_48.def)->name + pVar7);
                  if ((local_88->direction_ & 4) == 0) {
                    local_98._M_ptr =
                         (element_type *)
                         (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                          &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr->children)
                         .
                         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    local_98._M_ptr =
                         (element_type *)
                         ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                          &(local_98._M_ptr)->super_enable_shared_from_this<trieste::NodeDef> +
                         pVar7);
                  }
                  goto LAB_001619f3;
                }
              }
              local_98._M_ptr = (element_type *)(local_60._M_current + 1);
              goto LAB_001619f3;
            }
            local_80 = (long)&(local_48.def)->name + local_80;
            peVar10 = ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                      &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr;
          }
          local_98._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (peVar10->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_98._M_ptr = node;
          std::
          vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                    ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                      *)&local_78,
                     (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                      *)&local_98);
          pPVar12 = local_88;
        }
      }
    }
    std::
    _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::~_Vector_base(&local_78);
    sVar11 = local_80;
  }
  else {
    sVar11 = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
  return sVar11;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }